

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.c
# Opt level: O0

int fits_read_rgnfile(char *filename,WCSdata *wcs,SAORegion **Rgn,int *status)

{
  int iVar1;
  int local_3c;
  fitsfile *pfStack_38;
  int tstatus;
  fitsfile *fptr;
  int *status_local;
  SAORegion **Rgn_local;
  WCSdata *wcs_local;
  char *filename_local;
  
  local_3c = 0;
  if (*status == 0) {
    fptr = (fitsfile *)status;
    status_local = (int *)Rgn;
    Rgn_local = (SAORegion **)wcs;
    wcs_local = (WCSdata *)filename;
    ffpmrk();
    iVar1 = ffopen(&stack0xffffffffffffffc8,(char *)wcs_local,0,&local_3c);
    if (iVar1 == 0) {
      fits_read_fits_region
                (pfStack_38,(WCSdata *)Rgn_local,(SAORegion **)status_local,&fptr->HDUposition);
    }
    else {
      ffcmrk();
      fits_read_ascii_region
                ((char *)wcs_local,(WCSdata *)Rgn_local,(SAORegion **)status_local,
                 &fptr->HDUposition);
    }
    filename_local._4_4_ = fptr->HDUposition;
  }
  else {
    filename_local._4_4_ = *status;
  }
  return filename_local._4_4_;
}

Assistant:

int fits_read_rgnfile( const char *filename,
            WCSdata    *wcs,
            SAORegion  **Rgn,
            int        *status )
/*  Read regions from either a FITS or ASCII region file and return the information     */
/*  in the "SAORegion" structure.  If it is nonNULL, use wcs to convert the  */
/*  region coordinates to pixels.  Return an error if region is in degrees   */
/*  but no WCS data is provided.                                             */
/*---------------------------------------------------------------------------*/
{
  fitsfile *fptr;
  int tstatus = 0;

  if( *status ) return( *status );

  /* try to open as a FITS file - if that doesn't work treat as an ASCII file */

  fits_write_errmark();
  if ( ffopen(&fptr, filename, READONLY, &tstatus) ) {
    fits_clear_errmark();
    fits_read_ascii_region(filename, wcs, Rgn, status);
  } else {
    fits_read_fits_region(fptr, wcs, Rgn, status);
  }

  return(*status);

}